

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O0

StreamException * __thiscall
Centaurus::Stream::toomany(StreamException *__return_storage_ptr__,Stream *this,int count)

{
  ostream *poVar1;
  void *this_00;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream stream;
  int count_local;
  Stream *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_line);
  poVar1 = std::operator<<(poVar1,", Pos ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_pos);
  poVar1 = std::operator<<(poVar1,": The number of rules exceeded ");
  this_00 = (void *)std::ostream::operator<<(poVar1,std::dec);
  std::ostream::operator<<(this_00,count);
  std::__cxx11::ostringstream::str();
  StreamException::StreamException(__return_storage_ptr__,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

StreamException toomany(int count)
    {
        std::ostringstream stream;

        stream << "Line " << m_line << ", Pos " << m_pos << ": The number of rules exceeded " << std::dec << count;

        return StreamException(stream.str());
    }